

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_enum.c
# Opt level: O1

upb_MiniTableEnum *
upb_MtDecoder_BuildMiniTableEnum(upb_MdEnumDecoder *decoder,char *data,size_t len)

{
  byte bVar1;
  int iVar2;
  upb_MiniTableEnum *puVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong in_RCX;
  ulong uVar7;
  byte *pbVar8;
  byte *pbVar9;
  uint uVar10;
  byte *in_R11;
  bool bVar11;
  
  iVar2 = _setjmp((__jmp_buf_tag *)(decoder->base).err);
  if (iVar2 == 0) {
    if (len != 0) {
      if (*data != '!') {
        upb_MdDecoder_ErrorJmp(&decoder->base,"Invalid enum version: %c");
      }
      data = data + 1;
    }
    if (decoder->enum_table == (upb_MiniTableEnum *)0x0) {
      upb_MdDecoder_ErrorJmp(&decoder->base,"Out of memory");
    }
    decoder->enum_table->mask_limit_dont_copy_me__upb_internal_use_only = 0x40;
    puVar3 = _upb_MiniTable_AddEnumDataMember(decoder,0);
    decoder->enum_table = puVar3;
    puVar3 = _upb_MiniTable_AddEnumDataMember(decoder,0);
    decoder->enum_table = puVar3;
    puVar3->value_count_dont_copy_me__upb_internal_use_only = 0;
    pbVar8 = (byte *)(decoder->base).end;
    if (data < pbVar8) {
      uVar4 = 0;
      do {
        bVar1 = *data;
        data = (char *)((byte *)data + 1);
        uVar7 = (long)(char)bVar1 & 0xffffffff;
        if ((long)(char)bVar1 < 0x42) {
          uVar5 = 0xffffffff;
          if (0xa0 < (byte)(bVar1 + 0x81)) {
            uVar5 = (uint)""[(int)(char)bVar1 - 0x20];
          }
          uVar7 = (ulong)uVar5;
          iVar2 = 0;
          do {
            uVar5 = (uint)uVar4;
            if ((uVar7 & 1) != 0) {
              puVar3 = decoder->enum_table;
              uVar6 = decoder->enum_value_count + 1;
              decoder->enum_value_count = uVar6;
              if (puVar3->value_count_dont_copy_me__upb_internal_use_only == 0) {
                if ((uint)(uVar4 >> 5) <= uVar6 || uVar5 < 0x201) {
                  uVar6 = puVar3->mask_limit_dont_copy_me__upb_internal_use_only;
                  while (uVar6 < (uVar5 & 0xffffffe0) + 0x20) {
                    puVar3 = _upb_MiniTable_AddEnumDataMember(decoder,0);
                    uVar6 = puVar3->mask_limit_dont_copy_me__upb_internal_use_only + 0x20;
                    puVar3->mask_limit_dont_copy_me__upb_internal_use_only = uVar6;
                  }
                  (&puVar3[1].mask_limit_dont_copy_me__upb_internal_use_only)[uVar4 >> 5] =
                       (&puVar3[1].mask_limit_dont_copy_me__upb_internal_use_only)[uVar4 >> 5] |
                       1 << ((byte)uVar4 & 0x1f);
                  goto LAB_00122eef;
                }
                if (decoder->enum_data_count !=
                    puVar3->mask_limit_dont_copy_me__upb_internal_use_only >> 5) {
                  __assert_fail("d->enum_data_count == table->mask_limit_dont_copy_me__upb_internal_use_only / 32"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mini_descriptor/build_enum.c"
                                ,0x38,
                                "void upb_MiniTableEnum_BuildValue(upb_MdEnumDecoder *, uint32_t)");
                }
              }
              puVar3 = _upb_MiniTable_AddEnumDataMember(decoder,uVar5);
              puVar3->value_count_dont_copy_me__upb_internal_use_only =
                   puVar3->value_count_dont_copy_me__upb_internal_use_only + 1;
            }
LAB_00122eef:
            iVar2 = iVar2 + 1;
            uVar5 = uVar5 + 1;
            uVar7 = uVar7 >> 1;
            uVar4 = (ulong)uVar5;
          } while (iVar2 != 5);
          in_RCX = in_RCX & 0xffffffff;
        }
        else {
          if (0x1f < (byte)(bVar1 + 0xa1)) {
            upb_MdDecoder_ErrorJmp
                      (&decoder->base,"Unexpected character: %c",(ulong)(uint)(int)(char)bVar1);
          }
          for (uVar5 = 0x1f; 0x1eU >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
          uVar10 = 0;
          pbVar9 = (byte *)data;
          in_RCX = in_RCX & 0xffffffff;
          uVar6 = uVar10;
          do {
            data = (char *)pbVar9;
            iVar2 = -1;
            if (0xa0 < (byte)((char)uVar7 + 0x81U)) {
              iVar2 = (int)""[((uint)uVar7 & 0xff) - 0x20];
            }
            uVar6 = uVar6 | iVar2 + -0x3c << ((byte)uVar10 & 0x1f);
            if (((byte *)data == pbVar8) || (bVar1 = *data, (byte)(bVar1 + 0x81) < 0xe0)) {
              bVar11 = false;
              in_RCX = (ulong)uVar6;
              pbVar9 = (byte *)data;
            }
            else {
              pbVar9 = (byte *)data + 1;
              uVar10 = uVar10 + (uVar5 ^ 0xffffffe0) + 0x21;
              bVar11 = uVar10 < 0x20;
              data = (char *)in_R11;
              if (!bVar11) {
                data = (char *)0x0;
              }
              uVar7 = (ulong)bVar1;
            }
            in_R11 = (byte *)data;
          } while (bVar11);
          if ((byte *)data == (byte *)0x0) {
            upb_MdDecoder_ErrorJmp(&decoder->base,"Overlong varint");
          }
          uVar5 = (int)uVar4 + (int)in_RCX;
        }
        pbVar8 = (byte *)(decoder->base).end;
        uVar4 = (ulong)uVar5;
      } while (data < pbVar8);
    }
    puVar3 = decoder->enum_table;
  }
  else {
    puVar3 = (upb_MiniTableEnum *)0x0;
  }
  return puVar3;
}

Assistant:

static upb_MiniTableEnum* upb_MtDecoder_BuildMiniTableEnum(
    upb_MdEnumDecoder* const decoder, const char* const data,
    size_t const len) {
  if (UPB_SETJMP(decoder->base.err) != 0) return NULL;
  return upb_MtDecoder_DoBuildMiniTableEnum(decoder, data, len);
}